

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O1

wchar_t borg_launch_bolt(wchar_t rad,wchar_t dam,wchar_t typ,wchar_t max,wchar_t ammo_location)

{
  byte bVar1;
  loc_conflict t;
  chunk_conflict *pcVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  loc lVar9;
  loc_conflict lVar10;
  loc_conflict lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  wchar_t y;
  borg_grid *pbVar23;
  bool bVar24;
  wchar_t local_f4;
  uint local_d8;
  uint local_d4;
  int local_d0;
  wchar_t local_cc;
  wchar_t local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  wchar_t local_b4;
  wchar_t local_b0;
  wchar_t local_ac;
  _Bool *local_a8;
  borg_grid *local_a0;
  ulong local_98;
  wchar_t local_90;
  wchar_t local_8c;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  wchar_t local_64;
  long local_60;
  _Bool *local_58;
  wchar_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_b0 = dam;
  local_8c = ammo_location;
  if (borg_temp_n < 1) {
    local_b8 = 0;
    local_cc = L'\xffffffff';
    local_bc = 0;
    local_d0 = -1;
  }
  else {
    local_90 = (wchar_t)z_info->max_range;
    local_48 = (ulong)(uint)-max;
    local_60 = (long)rad * -0xc;
    local_40 = (ulong)(uint)(rad * 2);
    lVar21 = 0;
    local_d0 = -1;
    local_bc = 0;
    local_b8 = 0;
    local_cc = L'\xffffffff';
    local_c8 = typ;
    local_ac = max;
    do {
      local_c0 = -1;
      local_38 = lVar21;
      do {
        iVar13 = -1;
        do {
          pcVar2 = cave;
          bVar1 = borg_temp_x[lVar21];
          lVar16 = (long)local_c0;
          local_70 = (long)iVar13 + (ulong)borg_temp_y[lVar21];
          borg_tp_other_n = 0;
          uVar22 = (uint)(lVar16 + (ulong)bVar1);
          local_c4 = iVar13;
          lVar9 = (loc)loc(uVar22,(int)local_70);
          _Var3 = square_in_bounds(pcVar2,lVar9);
          if (_Var3) {
            lVar10 = loc((uint)borg_temp_x[lVar21],(uint)borg_temp_y[lVar21]);
            lVar11.y = borg.c.y;
            lVar11.x = borg.c.x;
            wVar4 = distance(lVar11,lVar10);
            lVar17 = local_70;
            uVar15 = (uint)local_70;
            if (uVar22 == borg_temp_x[lVar21]) {
              if ((typ != L'-') || (uVar15 == borg_temp_y[lVar21])) {
LAB_002089ce:
                local_78 = lVar16 + (ulong)bVar1;
                local_64 = wVar4;
                lVar11 = loc(uVar22,uVar15);
                lVar10.y = borg.c.y;
                lVar10.x = borg.c.x;
                wVar5 = distance(lVar10,lVar11);
                wVar4 = w_x;
                if (wVar5 <= local_ac) {
                  if ((rad < L'\x02') || (borg_grids[lVar17][local_78].feat == '\0')) {
                    wVar5 = L'\0';
                    if ((uVar15 == borg_temp_y[lVar21]) &&
                       (wVar5 = L'\0', (uint)local_78 == (uint)borg_temp_x[lVar21]))
                    goto LAB_00208a52;
                  }
                  else {
LAB_00208a52:
                    local_d8 = (uint)local_78;
                    local_d4 = uVar15;
                    wVar6 = borg_panel_wid();
                    wVar5 = w_y;
                    local_a0 = (borg_grid *)CONCAT44(local_a0._4_4_,wVar4 / wVar6);
                    wVar4 = borg_panel_hgt();
                    uVar15 = local_d4;
                    uVar22 = local_d8;
                    iVar14 = borg.c.y;
                    iVar13 = borg.c.x;
                    pcVar2 = cave;
                    local_a8 = (_Bool *)CONCAT44(local_a8._4_4_,wVar5 / wVar4);
                    uVar20 = (ulong)local_d8;
                    uVar12 = (ulong)local_d4;
                    lVar9 = (loc)loc(local_d8,local_d4);
                    _Var3 = square_in_bounds_fully(pcVar2,lVar9);
                    typ = local_c8;
                    lVar21 = local_38;
                    wVar5 = L'\0';
                    if (_Var3) {
                      local_d8 = iVar13;
                      local_d4 = iVar14;
                      lVar16 = (long)(int)uVar22 * 3;
                      local_98 = uVar20;
                      local_88 = uVar12;
                      if ((int)(uint)borg_kills[borg_grids[(int)uVar15][(int)uVar22].kill].r_idx <
                          (int)(z_info->r_max - 1)) {
                        local_f4 = L'\0';
                        local_80 = lVar16;
                        bVar24 = max < L'\x02';
                        if (L'\x01' < local_ac) {
                          lVar16 = (long)(int)local_a0;
                          lVar19 = (long)(int)local_a8;
                          local_a0 = (borg_grid *)(borg_detect_wall[(int)local_a8] + lVar16);
                          iVar18 = (int)local_a8 + 1;
                          local_a8 = borg_detect_wall[iVar18] + lVar16;
                          local_58 = borg_detect_wall[iVar18] + lVar16 + 1;
                          local_50 = &r_info[borg_kills[borg_grids[(int)uVar15][(int)uVar22].kill].
                                             r_idx].light;
                          bVar24 = false;
                          wVar4 = L'\x02';
                          local_f4 = L'\0';
                          local_b4 = iVar14;
                          do {
                            borg_inc_motion((int *)&local_d4,(int *)&local_d8,local_b4,iVar13,
                                            (wchar_t)local_88,(wchar_t)local_98);
                            pcVar2 = cave;
                            lVar9 = (loc)loc(local_d8,local_d4);
                            _Var3 = square_in_bounds_fully(pcVar2,lVar9);
                            if (!_Var3) break;
                            pbVar23 = borg_grids[(int)local_d4] + (int)local_d8;
                            _Var3 = borg_cave_floor_grid(pbVar23);
                            if ((!_Var3) || (pbVar23->feat == '\x18')) {
joined_r0x00209074:
                              lVar21 = local_38;
                              wVar5 = local_f4;
                              if ((rad != L'\n') && (rad != L'\xffffffff')) {
                                wVar5 = L'\0';
                              }
                              goto LAB_00208d2a;
                            }
                            if (rad == L'\n' || rad < L'\x01') {
                              wVar5 = borg_launch_bolt_aux_hack
                                                ((uint)pbVar23->kill,local_b0,typ,local_8c);
                              local_f4 = local_f4 + wVar5;
                            }
                            if ((rad != L'\xffffffff') && (rad != L'\n')) {
                              if ((local_d8 == (uint)local_98) && (local_d4 == (uint)local_88))
                              break;
                              if ((rad == L'\0') &&
                                 (lVar21 = local_38, wVar5 = local_f4, pbVar23->kill != '\0'))
                              goto LAB_00208d2a;
                            }
                            if (borg.trait[0x25] != 0) {
                              if ((((local_a0->feat != '\0') ||
                                   (borg_detect_wall[lVar19][lVar16 + 1] != false)) ||
                                  (*local_a8 != false)) ||
                                 ((*local_58 != false ||
                                  ((int)avoidance / 0x14 <=
                                   (int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb]))))
                              goto LAB_0020902f;
                              if (pbVar23->feat == '\0') goto joined_r0x00209074;
                              if (L'\xffffffff' < successful_target) goto LAB_0020902f;
LAB_0020908a:
                              if (successful_target < L'\xfffffff5') {
                                successful_target = L'\0';
                              }
                              goto joined_r0x00209074;
                            }
                            if (((borg.trait[0x34] < 1) && (*local_50 < L'\x01')) &&
                               (pbVar23->feat == '\0')) goto joined_r0x00209074;
LAB_0020902f:
                            if (successful_target < L'\0') goto LAB_0020908a;
                            bVar24 = local_ac <= wVar4;
                            iVar14 = (int)local_48 + wVar4;
                            wVar4 = wVar4 + L'\x01';
                          } while (iVar14 != 0);
                        }
                        wVar5 = L'\0';
                        if (rad < L'\x01') {
                          wVar5 = local_f4;
                        }
                        lVar21 = local_38;
                        if (L'\0' < rad && !bVar24) {
                          iVar13 = (int)local_88 - rad;
                          iVar14 = (int)local_88 + rad;
                          local_a8 = (_Bool *)CONCAT44(local_a8._4_4_,iVar14);
                          wVar5 = local_f4;
                          if (iVar13 < iVar14) {
                            wVar4 = (int)local_98 - rad;
                            local_b4 = rad + (int)local_98;
                            lVar16 = (long)iVar13;
                            local_80 = local_60 + local_80 * 4;
                            do {
                              if (wVar4 < local_b4) {
                                uVar20 = local_40 & 0xffffffff;
                                lVar21 = local_80;
                                wVar6 = wVar4;
                                do {
                                  pcVar2 = cave;
                                  wVar8 = (wchar_t)lVar16;
                                  lVar9 = (loc)loc(wVar6,wVar8);
                                  _Var3 = square_in_bounds(pcVar2,lVar9);
                                  if (_Var3) {
                                    local_a0 = borg_grids[lVar16];
                                    y = (wchar_t)local_88;
                                    wVar7 = borg_distance(y,(wchar_t)local_98,wVar8,wVar6);
                                    if ((wVar7 <= rad) &&
                                       (_Var3 = borg_los(y,(wchar_t)local_98,wVar8,wVar6),
                                       pbVar23 = local_a0, _Var3)) {
                                      iVar13 = wVar7 + L'\x01';
                                      if (rad == L'\n') {
                                        iVar13 = 1;
                                      }
                                      wVar8 = borg_launch_bolt_aux_hack
                                                        ((uint)(&local_a0->kill)[lVar21],
                                                         local_b0 / iVar13,local_c8,local_8c);
                                      wVar5 = wVar5 + wVar8;
                                      uVar12 = (ulong)(&pbVar23->take)[lVar21];
                                      if ((uVar12 != 0) &&
                                         (borg_takes[uVar12].kind != (object_kind *)0x0)) {
                                        wVar8 = borg_launch_destroy_stuff
                                                          ((borg_grid *)(&pbVar23->feat + lVar21),
                                                           local_c8);
                                        wVar5 = wVar5 - wVar8;
                                      }
                                    }
                                  }
                                  lVar21 = lVar21 + 0xc;
                                  wVar6 = wVar6 + L'\x01';
                                  uVar22 = (int)uVar20 - 1;
                                  uVar20 = (ulong)uVar22;
                                } while (uVar22 != 0);
                              }
                              lVar16 = lVar16 + 1;
                              lVar17 = local_70;
                              lVar21 = local_38;
                              typ = local_c8;
                            } while ((int)local_a8 != (int)lVar16);
                          }
                        }
                      }
                    }
                  }
LAB_00208d2a:
                  iVar13 = (int)local_78;
                  if ((typ == L'-') && (L'\0' < wVar5)) {
                    wVar5 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                    iVar13 = (int)local_78;
                    wVar5 = local_b0 - wVar5;
                  }
                  borg_tp_other_n = 0;
                  if (((((L'\0' < wVar5) && ((int)lVar17 != 0x41)) && (iVar13 != 0xc5)) &&
                      (((iVar13 != 0 && ((int)lVar17 != 0)) &&
                       ((local_d0 < 0 || (local_cc <= wVar5)))))) &&
                     ((wVar5 != local_cc || (local_64 <= local_90)))) {
                    local_bc = local_c0;
                    local_d0 = (int)lVar21;
                    local_cc = wVar5;
                    local_b8 = local_c4;
                    local_90 = local_64;
                  }
                }
              }
            }
            else if (typ != L'-') goto LAB_002089ce;
          }
          iVar13 = local_c4 + 1;
        } while (iVar13 != 2);
        local_c0 = local_c0 + 1;
      } while (local_c0 != 2);
      lVar21 = lVar21 + 1;
    } while (lVar21 < borg_temp_n);
    local_c0 = 2;
  }
  if ((local_d0 != -1) && (borg_tp_other_n = 0, borg_simulate == false)) {
    borg.goal.g.x = local_bc + (uint)borg_temp_x[local_d0];
    borg.goal.g.y = local_b8 + (uint)borg_temp_y[local_d0];
    t.y = borg.goal.g.y;
    t.x = borg.goal.g.x;
    borg_target(t);
  }
  return local_cc;
}

Assistant:

int borg_launch_bolt(int rad, int dam, int typ, int max, int ammo_location)
{
    int i     = 0;
    int b_i   = -1;
    int n     = 0;
    int b_n   = -1;
    int b_o_y = 0, b_o_x = 0;
    int o_y = 0, o_x = 0;
    int d, b_d       = z_info->max_range;

    /* Examine possible destinations */

    /* This will allow the borg to target places adjacent to a monster
     * in order to exploit and abuse a feature of the game.  Whereas,
     * the borg, while targeting a monster will not score d/t walls, he
     * could land a successful hit by targeting adjacent to the monster.
     * For example:
     * ######################
     * #####....@......######
     * ############Px........
     * ######################
     * In order to hit the P, the borg must target the x and not the P.
     *
     */
    for (i = 0; i < borg_temp_n; i++) {
        int x = borg_temp_x[i];
        int y = borg_temp_y[i];

        /* Consider each adjacent spot to and on top of the monster */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x = borg_temp_x[i] + o_x;
                y = borg_temp_y[i] + o_y;

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;
                n               = 0;

                /* Bounds check */
                if (!square_in_bounds(cave, loc(x, y)))
                    continue;

                /* Remember how far away the monster is */
                d = distance(borg.c, loc(borg_temp_x[i], borg_temp_y[i]));

                /* Skip certain types of Offset attacks */
                if ((x != borg_temp_x[i] || y != borg_temp_y[i])
                    && typ == BORG_ATTACK_AWAY_ALL)
                    continue;

                /* Skip places that are out of range */
                if (distance(borg.c, loc(x, y)) > max)
                    continue;

                /* Consider it if its a ball spell or right on top of it */
                if ((rad >= 2 && borg_grids[y][x].feat != FEAT_NONE)
                    || (y == borg_temp_y[i] && x == borg_temp_x[i]))
                    n = borg_launch_bolt_at_location(
                        y, x, rad, dam, typ, max, ammo_location);

                /* Teleport Other is now considered */
                if (typ == BORG_ATTACK_AWAY_ALL && n > 0) {
                    /* Consider danger with certain monsters removed
                     * from the danger check.  They were removed from the list
                     * of considered monsters (borg_tp_other array)
                     */
                    n = borg_danger(borg.c.y, borg.c.x, 1, true, false);

                    /* since this is the danger after monster removal */
                    /* and dam for tel away is the previous danger */
                    /* we want the biggest reduction in danger */
                    n = dam - n;
                }

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;

                /* Skip useless attacks */
                if (n <= 0)
                    continue;

                /* The game forbids targetting the outside walls */
                if (x == 0 || y == 0 || x == DUNGEON_WID - 1
                    || y == DUNGEON_HGT - 1)
                    continue;

                /* Collect best attack */
                if ((b_i >= 0) && (n < b_n))
                    continue;

                /* Skip attacking farther monster if rewards are equal. */
                if (n == b_n && d > b_d)
                    continue;

                /* Track it */
                b_i   = i;
                b_n   = n;
                b_o_y = o_y;
                b_o_x = o_x;
                b_d   = d;
            }
        }
    }
    if (b_i == -1)
        return b_n;

    /* Reset Teleport Other variables */
    borg_tp_other_n = 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Save the location */
    borg.goal.g.x = borg_temp_x[b_i] + b_o_x;
    borg.goal.g.y = borg_temp_y[b_i] + b_o_y;

    /* Target the location */
    (void)borg_target(borg.goal.g);

    /* Result */
    return b_n;
}